

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int sam_format1(bam_hdr_t *h,bam1_t *b,kstring_t *str)

{
  char cVar1;
  uint8_t uVar2;
  char cVar3;
  byte bVar4;
  ushort uVar5;
  float fVar6;
  uint8_t *puVar7;
  bool bVar8;
  float fVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  ushort uVar19;
  byte *pbVar20;
  int iVar21;
  double *pdVar22;
  byte bVar23;
  size_t sVar24;
  uint uVar25;
  size_t sVar26;
  size_t sVar27;
  bam1_t *pbVar28;
  int iVar29;
  int iVar30;
  double *pdVar31;
  long lVar32;
  double *pdVar33;
  double dVar34;
  char buf [16];
  undefined8 uStack_60;
  byte local_58 [16];
  bam1_t *local_48;
  bam_hdr_t *local_40;
  double *local_38;
  
  str->l = 0;
  puVar7 = b->data;
  bVar23 = (b->core).field_0xb;
  local_48 = b;
  local_40 = h;
  if ((ulong)bVar23 < str->m) {
    pcVar13 = str->s;
    sVar27 = 0;
LAB_00114185:
    sVar26 = (ulong)bVar23 - 1;
    uStack_60 = 0x114196;
    memcpy(pcVar13 + sVar27,puVar7,sVar26);
    sVar27 = sVar26 + str->l;
    str->l = sVar27;
    str->s[sVar27] = '\0';
  }
  else {
    bVar4 = bVar23 >> 1 | bVar23;
    bVar4 = bVar4 >> 2 | bVar4;
    sVar26 = (ulong)(byte)(bVar4 >> 4 | bVar4) + 1;
    str->m = sVar26;
    uStack_60 = 0x114179;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      sVar27 = str->l;
      goto LAB_00114185;
    }
  }
  sVar27 = str->l;
  uVar12 = sVar27 + 1;
  if (uVar12 < str->m) {
    pcVar13 = str->s;
LAB_00114213:
    str->l = uVar12;
    pcVar13[sVar27] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar26;
    uStack_60 = 0x1141fe;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
      goto LAB_00114213;
    }
  }
  pbVar28 = local_48;
  lVar11 = 0;
  uVar12 = 0;
  uVar10 = (uint)*(ushort *)&(local_48->core).field_0xc;
  do {
    uVar14 = uVar12;
    local_58[uVar14] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
    lVar11 = lVar11 + 0x100000000;
    bVar8 = 9 < uVar10;
    uVar12 = uVar14 + 1;
    uVar10 = uVar10 / 10;
  } while (bVar8);
  uVar12 = (lVar11 >> 0x20) + str->l + 1;
  if (uVar12 < str->m) {
LAB_001142c6:
    uVar12 = uVar14 + 2;
    pbVar20 = local_58 + (uVar14 + 1 & 0xffffffff);
    do {
      pbVar20 = pbVar20 + -1;
      bVar23 = *pbVar20;
      sVar27 = str->l;
      str->l = sVar27 + 1;
      str->s[sVar27] = bVar23;
      uVar10 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar10;
    } while (1 < (int)uVar10);
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar26;
    uStack_60 = 0x1142bd;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      goto LAB_001142c6;
    }
  }
  sVar27 = str->l;
  uVar12 = sVar27 + 1;
  if (uVar12 < str->m) {
    pcVar13 = str->s;
LAB_0011435f:
    str->l = uVar12;
    pcVar13[sVar27] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar26;
    uStack_60 = 0x11434f;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
      goto LAB_0011435f;
    }
  }
  lVar11 = (long)(pbVar28->core).tid;
  if (lVar11 < 0) {
    sVar27 = str->l;
    uVar12 = sVar27 + 3;
    if (uVar12 < str->m) {
      pcVar13 = str->s;
LAB_001144f6:
      (pcVar13 + sVar27)[0] = '*';
      (pcVar13 + sVar27)[1] = '\t';
      sVar27 = str->l + 2;
      str->l = sVar27;
      pcVar13 = str->s + sVar27;
      goto LAB_0011450a;
    }
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar26;
    uStack_60 = 0x1144ea;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      sVar27 = str->l;
      goto LAB_001144f6;
    }
  }
  else {
    pcVar13 = local_40->target_name[lVar11];
    uStack_60 = 0x11438e;
    sVar26 = strlen(pcVar13);
    sVar27 = str->l;
    sVar26 = (size_t)(int)sVar26;
    uVar12 = sVar27 + sVar26 + 1;
    if (uVar12 < str->m) {
      pcVar17 = str->s;
LAB_0011440e:
      uStack_60 = 0x11441c;
      memcpy(pcVar17 + sVar27,pcVar13,sVar26);
      sVar27 = sVar26 + str->l;
      str->l = sVar27;
      str->s[sVar27] = '\0';
    }
    else {
      uVar12 = uVar12 >> 1 | uVar12;
      uVar12 = uVar12 >> 2 | uVar12;
      uVar12 = uVar12 >> 4 | uVar12;
      uVar12 = uVar12 >> 8 | uVar12;
      sVar24 = (uVar12 >> 0x10 | uVar12) + 1;
      str->m = sVar24;
      uStack_60 = 0x114402;
      pcVar17 = (char *)realloc(str->s,sVar24);
      if (pcVar17 != (char *)0x0) {
        str->s = pcVar17;
        sVar27 = str->l;
        goto LAB_0011440e;
      }
    }
    sVar27 = str->l;
    uVar12 = sVar27 + 1;
    if (uVar12 < str->m) {
      pcVar13 = str->s;
    }
    else {
      uVar12 = uVar12 >> 1 | uVar12;
      uVar12 = uVar12 >> 2 | uVar12;
      uVar12 = uVar12 >> 4 | uVar12;
      uVar12 = uVar12 >> 8 | uVar12;
      sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
      str->m = sVar26;
      uStack_60 = 0x114484;
      pcVar13 = (char *)realloc(str->s,sVar26);
      pbVar28 = local_48;
      if (pcVar13 == (char *)0x0) goto LAB_0011450d;
      str->s = pcVar13;
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
    }
    str->l = uVar12;
    pcVar13[sVar27] = '\t';
    pcVar13 = str->s + str->l;
    pbVar28 = local_48;
LAB_0011450a:
    *pcVar13 = '\0';
  }
LAB_0011450d:
  iVar29 = (pbVar28->core).pos;
  uVar10 = iVar29 + 1;
  uVar25 = -uVar10;
  if (0 < (int)uVar10) {
    uVar25 = uVar10;
  }
  uVar12 = 0;
  do {
    local_58[uVar12] = (char)uVar25 + (char)(uVar25 / 10) * -10 | 0x30;
    uVar12 = uVar12 + 1;
    bVar8 = 9 < uVar25;
    uVar25 = uVar25 / 10;
  } while (bVar8);
  if (iVar29 < -1) {
    uVar14 = uVar12 & 0xffffffff;
    uVar12 = (ulong)((int)uVar12 + 1);
    local_58[uVar14] = 0x2d;
  }
  uVar14 = str->l + (long)(int)uVar12 + 1;
  if (uVar14 < str->m) {
LAB_001145b6:
    iVar29 = (int)uVar12 + 1;
    pbVar20 = local_58 + (uVar12 & 0xffffffff);
    do {
      pbVar20 = pbVar20 + -1;
      bVar23 = *pbVar20;
      sVar27 = str->l;
      str->l = sVar27 + 1;
      str->s[sVar27] = bVar23;
      iVar29 = iVar29 + -1;
    } while (1 < iVar29);
    str->s[str->l] = '\0';
  }
  else {
    uVar14 = uVar14 >> 1 | uVar14;
    uVar14 = uVar14 >> 2 | uVar14;
    uVar14 = uVar14 >> 4 | uVar14;
    uVar14 = uVar14 >> 8 | uVar14;
    sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
    str->m = sVar26;
    uStack_60 = 0x1145ad;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      goto LAB_001145b6;
    }
  }
  sVar27 = str->l;
  uVar12 = sVar27 + 1;
  if (uVar12 < str->m) {
    pcVar13 = str->s;
LAB_00114667:
    str->l = uVar12;
    pcVar13[sVar27] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar26;
    uStack_60 = 0x11464d;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
      goto LAB_00114667;
    }
  }
  lVar11 = 0;
  uVar12 = 0;
  uVar10 = (uint)(byte)(pbVar28->core).field_0xa;
  do {
    uVar14 = uVar12;
    local_58[uVar14] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
    lVar11 = lVar11 + 0x100000000;
    bVar8 = 9 < uVar10;
    uVar12 = uVar14 + 1;
    uVar10 = uVar10 / 10;
  } while (bVar8);
  uVar12 = (lVar11 >> 0x20) + str->l + 1;
  if (uVar12 < str->m) {
LAB_00114710:
    uVar12 = uVar14 + 2;
    pbVar20 = local_58 + (uVar14 + 1 & 0xffffffff);
    do {
      pbVar20 = pbVar20 + -1;
      bVar23 = *pbVar20;
      sVar27 = str->l;
      str->l = sVar27 + 1;
      str->s[sVar27] = bVar23;
      uVar10 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar10;
    } while (1 < (int)uVar10);
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar26;
    uStack_60 = 0x114707;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      goto LAB_00114710;
    }
  }
  sVar27 = str->l;
  uVar12 = sVar27 + 1;
  if (uVar12 < str->m) {
    pcVar13 = str->s;
LAB_001147a9:
    str->l = uVar12;
    pcVar13[sVar27] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar26;
    uStack_60 = 0x114799;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
      goto LAB_001147a9;
    }
  }
  uVar12 = *(ulong *)&(pbVar28->core).field_0x8;
  if (uVar12 >> 0x30 == 0) {
    sVar27 = str->l;
    uVar12 = sVar27 + 1;
    if (uVar12 < str->m) {
      pcVar13 = str->s;
    }
    else {
      uVar12 = uVar12 >> 1 | uVar12;
      uVar12 = uVar12 >> 2 | uVar12;
      uVar12 = uVar12 >> 4 | uVar12;
      uVar12 = uVar12 >> 8 | uVar12;
      sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
      str->m = sVar26;
      uStack_60 = 0x1149d2;
      pcVar13 = (char *)realloc(str->s,sVar26);
      if (pcVar13 == (char *)0x0) goto LAB_001149f4;
      str->s = pcVar13;
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
    }
    str->l = uVar12;
    pcVar13[sVar27] = '*';
    str->s[str->l] = '\0';
  }
  else {
    uVar14 = uVar12 >> 0x18 & 0xff;
    puVar7 = pbVar28->data;
    uVar12 = 0;
    do {
      uVar25 = 1;
      lVar11 = 0;
      lVar18 = 0;
      uVar10 = *(uint *)(puVar7 + uVar12 * 4 + uVar14) >> 4;
      iVar29 = 2;
      do {
        iVar30 = iVar29;
        uVar16 = (ulong)uVar25;
        local_58[lVar18] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
        lVar18 = lVar18 + 1;
        lVar11 = lVar11 + 0x100000000;
        uVar25 = uVar25 + 1;
        bVar8 = 9 < uVar10;
        uVar10 = uVar10 / 10;
        iVar29 = iVar30 + 1;
      } while (bVar8);
      uVar15 = (lVar11 >> 0x20) + str->l + 1;
      if (uVar15 < str->m) {
LAB_001148b3:
        pbVar20 = local_58 + (uVar16 - 1);
        do {
          bVar23 = *pbVar20;
          sVar27 = str->l;
          str->l = sVar27 + 1;
          str->s[sVar27] = bVar23;
          iVar30 = iVar30 + -1;
          pbVar20 = pbVar20 + -1;
        } while (1 < iVar30);
        str->s[str->l] = '\0';
      }
      else {
        uVar15 = uVar15 >> 1 | uVar15;
        uVar15 = uVar15 >> 2 | uVar15;
        uVar15 = uVar15 >> 4 | uVar15;
        uVar15 = uVar15 >> 8 | uVar15;
        sVar26 = (uVar15 >> 0x10 | uVar15) + 1;
        str->m = sVar26;
        uStack_60 = 0x1148a0;
        pcVar13 = (char *)realloc(str->s,sVar26);
        if (pcVar13 != (char *)0x0) {
          str->s = pcVar13;
          goto LAB_001148b3;
        }
      }
      cVar1 = "MIDNSHP=XB"[*(uint *)(puVar7 + uVar12 * 4 + uVar14) & 0xf];
      sVar27 = str->l;
      uVar16 = sVar27 + 1;
      if (uVar16 < str->m) {
        pcVar13 = str->s;
LAB_00114968:
        str->l = uVar16;
        pcVar13[sVar27] = cVar1;
        str->s[str->l] = '\0';
      }
      else {
        uVar16 = uVar16 >> 1 | uVar16;
        uVar16 = uVar16 >> 2 | uVar16;
        uVar16 = uVar16 >> 4 | uVar16;
        uVar16 = uVar16 >> 8 | uVar16;
        sVar26 = (uVar16 >> 0x10 | uVar16) + 1;
        str->m = sVar26;
        uStack_60 = 0x11494e;
        pcVar13 = (char *)realloc(str->s,sVar26);
        if (pcVar13 != (char *)0x0) {
          str->s = pcVar13;
          sVar27 = str->l;
          uVar16 = sVar27 + 1;
          goto LAB_00114968;
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < *(ushort *)&(local_48->core).field_0xe);
  }
LAB_001149f4:
  sVar27 = str->l;
  uVar12 = sVar27 + 1;
  if (uVar12 < str->m) {
    pcVar13 = str->s;
LAB_00114a62:
    str->l = uVar12;
    pcVar13[sVar27] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar26;
    uStack_60 = 0x114a4d;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
      goto LAB_00114a62;
    }
  }
  pbVar28 = local_48;
  iVar29 = (local_48->core).mtid;
  if ((long)iVar29 < 0) {
    sVar27 = str->l;
    uVar12 = sVar27 + 3;
    if (uVar12 < str->m) {
      pcVar13 = str->s;
LAB_00114b3a:
      (pcVar13 + sVar27)[0] = '*';
      (pcVar13 + sVar27)[1] = '\t';
      goto LAB_00114b99;
    }
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar26;
    uStack_60 = 0x114b2a;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      sVar27 = str->l;
      goto LAB_00114b3a;
    }
  }
  else {
    if (iVar29 == (local_48->core).tid) {
      sVar27 = str->l;
      uVar12 = sVar27 + 3;
      if (uVar12 < str->m) {
        pcVar13 = str->s;
      }
      else {
        uVar12 = uVar12 >> 1 | uVar12;
        uVar12 = uVar12 >> 2 | uVar12;
        uVar12 = uVar12 >> 4 | uVar12;
        uVar12 = uVar12 >> 8 | uVar12;
        sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
        str->m = sVar26;
        uStack_60 = 0x114b83;
        pcVar13 = (char *)realloc(str->s,sVar26);
        if (pcVar13 == (char *)0x0) goto LAB_00114c95;
        str->s = pcVar13;
        sVar27 = str->l;
      }
      (pcVar13 + sVar27)[0] = '=';
      (pcVar13 + sVar27)[1] = '\t';
LAB_00114b99:
      sVar27 = str->l + 2;
      str->l = sVar27;
      pcVar13 = str->s + sVar27;
    }
    else {
      pcVar13 = local_40->target_name[iVar29];
      uStack_60 = 0x114ac9;
      sVar26 = strlen(pcVar13);
      sVar27 = str->l;
      sVar26 = (size_t)(int)sVar26;
      uVar12 = sVar27 + sVar26 + 1;
      if (uVar12 < str->m) {
        pcVar17 = str->s;
LAB_00114bf9:
        uStack_60 = 0x114c07;
        memcpy(pcVar17 + sVar27,pcVar13,sVar26);
        sVar27 = sVar26 + str->l;
        str->l = sVar27;
        str->s[sVar27] = '\0';
      }
      else {
        uVar12 = uVar12 >> 1 | uVar12;
        uVar12 = uVar12 >> 2 | uVar12;
        uVar12 = uVar12 >> 4 | uVar12;
        uVar12 = uVar12 >> 8 | uVar12;
        sVar24 = (uVar12 >> 0x10 | uVar12) + 1;
        str->m = sVar24;
        uStack_60 = 0x114bed;
        pcVar17 = (char *)realloc(str->s,sVar24);
        if (pcVar17 != (char *)0x0) {
          str->s = pcVar17;
          sVar27 = str->l;
          goto LAB_00114bf9;
        }
      }
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
      if (uVar12 < str->m) {
        pcVar13 = str->s;
      }
      else {
        uVar12 = uVar12 >> 1 | uVar12;
        uVar12 = uVar12 >> 2 | uVar12;
        uVar12 = uVar12 >> 4 | uVar12;
        uVar12 = uVar12 >> 8 | uVar12;
        sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
        str->m = sVar26;
        uStack_60 = 0x114c6f;
        pcVar13 = (char *)realloc(str->s,sVar26);
        pbVar28 = local_48;
        if (pcVar13 == (char *)0x0) goto LAB_00114c95;
        str->s = pcVar13;
        sVar27 = str->l;
        uVar12 = sVar27 + 1;
      }
      str->l = uVar12;
      pcVar13[sVar27] = '\t';
      pcVar13 = str->s + str->l;
      pbVar28 = local_48;
    }
    *pcVar13 = '\0';
  }
LAB_00114c95:
  iVar29 = (pbVar28->core).mpos;
  uVar10 = iVar29 + 1;
  uVar25 = -uVar10;
  if (0 < (int)uVar10) {
    uVar25 = uVar10;
  }
  uVar12 = 0;
  do {
    local_58[uVar12] = (char)uVar25 + (char)(uVar25 / 10) * -10 | 0x30;
    uVar12 = uVar12 + 1;
    bVar8 = 9 < uVar25;
    uVar25 = uVar25 / 10;
  } while (bVar8);
  if (iVar29 < -1) {
    uVar14 = uVar12 & 0xffffffff;
    uVar12 = (ulong)((int)uVar12 + 1);
    local_58[uVar14] = 0x2d;
  }
  uVar14 = str->l + (long)(int)uVar12 + 1;
  if (uVar14 < str->m) {
LAB_00114d3f:
    iVar29 = (int)uVar12 + 1;
    pbVar20 = local_58 + (uVar12 & 0xffffffff);
    do {
      pbVar20 = pbVar20 + -1;
      bVar23 = *pbVar20;
      sVar27 = str->l;
      str->l = sVar27 + 1;
      str->s[sVar27] = bVar23;
      iVar29 = iVar29 + -1;
    } while (1 < iVar29);
    str->s[str->l] = '\0';
  }
  else {
    uVar14 = uVar14 >> 1 | uVar14;
    uVar14 = uVar14 >> 2 | uVar14;
    uVar14 = uVar14 >> 4 | uVar14;
    uVar14 = uVar14 >> 8 | uVar14;
    sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
    str->m = sVar26;
    uStack_60 = 0x114d36;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      goto LAB_00114d3f;
    }
  }
  sVar27 = str->l;
  uVar12 = sVar27 + 1;
  if (uVar12 < str->m) {
    pcVar13 = str->s;
LAB_00114ddc:
    str->l = uVar12;
    pcVar13[sVar27] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar26;
    uStack_60 = 0x114dcc;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
      goto LAB_00114ddc;
    }
  }
  uVar10 = (pbVar28->core).isize;
  uVar25 = -uVar10;
  if (0 < (int)uVar10) {
    uVar25 = uVar10;
  }
  uVar12 = 0;
  do {
    local_58[uVar12] = (char)uVar25 + (char)(uVar25 / 10) * -10 | 0x30;
    uVar12 = uVar12 + 1;
    bVar8 = 9 < uVar25;
    uVar25 = uVar25 / 10;
  } while (bVar8);
  if ((int)uVar10 < 0) {
    uVar14 = uVar12 & 0xffffffff;
    uVar12 = (ulong)((int)uVar12 + 1);
    local_58[uVar14] = 0x2d;
  }
  uVar14 = str->l + (long)(int)uVar12 + 1;
  if (uVar14 < str->m) {
LAB_00114e94:
    iVar29 = (int)uVar12 + 1;
    pbVar20 = local_58 + (uVar12 & 0xffffffff);
    do {
      pbVar20 = pbVar20 + -1;
      bVar23 = *pbVar20;
      sVar27 = str->l;
      str->l = sVar27 + 1;
      str->s[sVar27] = bVar23;
      iVar29 = iVar29 + -1;
    } while (1 < iVar29);
    str->s[str->l] = '\0';
  }
  else {
    uVar14 = uVar14 >> 1 | uVar14;
    uVar14 = uVar14 >> 2 | uVar14;
    uVar14 = uVar14 >> 4 | uVar14;
    uVar14 = uVar14 >> 8 | uVar14;
    sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
    str->m = sVar26;
    uStack_60 = 0x114e8b;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      goto LAB_00114e94;
    }
  }
  sVar27 = str->l;
  uVar12 = sVar27 + 1;
  if (uVar12 < str->m) {
    pcVar13 = str->s;
LAB_00114f31:
    str->l = uVar12;
    pcVar13[sVar27] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar26;
    uStack_60 = 0x114f21;
    pcVar13 = (char *)realloc(str->s,sVar26);
    if (pcVar13 != (char *)0x0) {
      str->s = pcVar13;
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
      goto LAB_00114f31;
    }
  }
  iVar29 = (pbVar28->core).l_qseq;
  if (iVar29 == 0) {
    sVar27 = str->l;
    uVar12 = sVar27 + 4;
    if (uVar12 < str->m) {
      pcVar13 = str->s;
    }
    else {
      uVar12 = uVar12 >> 1 | uVar12;
      uVar12 = uVar12 >> 2 | uVar12;
      uVar12 = uVar12 >> 4 | uVar12;
      uVar12 = uVar12 >> 8 | uVar12;
      sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
      str->m = sVar26;
      uStack_60 = 0x1151ec;
      pcVar13 = (char *)realloc(str->s,sVar26);
      if (pcVar13 == (char *)0x0) goto LAB_00115279;
      str->s = pcVar13;
      sVar27 = str->l;
    }
    pcVar13[sVar27 + 2] = '*';
    (pcVar13 + sVar27)[0] = '*';
    (pcVar13 + sVar27)[1] = '\t';
    sVar27 = str->l + 3;
    str->l = sVar27;
    pcVar13 = str->s + sVar27;
  }
  else {
    if (0 < iVar29) {
      uVar12 = *(ulong *)&(local_48->core).field_0x8;
      puVar7 = local_48->data;
      bVar23 = 0;
      uVar10 = 0;
      do {
        cVar1 = "=ACMGRSVTWYHKDBN"
                [puVar7[(ulong)(uVar10 >> 1) + (uVar12 >> 0x18 & 0xff) + (uVar12 >> 0x30) * 4] >>
                 (~bVar23 & 4) & 0xf];
        sVar27 = str->l;
        uVar14 = sVar27 + 1;
        if (uVar14 < str->m) {
          pcVar13 = str->s;
LAB_00114fff:
          str->l = uVar14;
          pcVar13[sVar27] = cVar1;
          str->s[str->l] = '\0';
        }
        else {
          uVar14 = uVar14 >> 1 | uVar14;
          uVar14 = uVar14 >> 2 | uVar14;
          uVar14 = uVar14 >> 4 | uVar14;
          uVar14 = uVar14 >> 8 | uVar14;
          sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
          str->m = sVar26;
          uStack_60 = 0x114fef;
          pcVar13 = (char *)realloc(str->s,sVar26);
          if (pcVar13 != (char *)0x0) {
            str->s = pcVar13;
            sVar27 = str->l;
            uVar14 = sVar27 + 1;
            goto LAB_00114fff;
          }
        }
        uVar10 = uVar10 + 1;
        bVar23 = bVar23 + 4;
      } while ((int)uVar10 < (local_48->core).l_qseq);
    }
    sVar27 = str->l;
    uVar12 = sVar27 + 1;
    if (uVar12 < str->m) {
      pcVar13 = str->s;
LAB_001150ae:
      str->l = uVar12;
      pcVar13[sVar27] = '\t';
      str->s[str->l] = '\0';
    }
    else {
      uVar12 = uVar12 >> 1 | uVar12;
      uVar12 = uVar12 >> 2 | uVar12;
      uVar12 = uVar12 >> 4 | uVar12;
      uVar12 = uVar12 >> 8 | uVar12;
      sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
      str->m = sVar26;
      uStack_60 = 0x115099;
      pcVar13 = (char *)realloc(str->s,sVar26);
      if (pcVar13 != (char *)0x0) {
        str->s = pcVar13;
        sVar27 = str->l;
        uVar12 = sVar27 + 1;
        goto LAB_001150ae;
      }
    }
    pbVar28 = local_48;
    uVar12 = *(ulong *)&(local_48->core).field_0x8;
    puVar7 = local_48->data;
    lVar11 = (uVar12 >> 0x18 & 0xff) + (uVar12 >> 0x30) * 4;
    iVar29 = (local_48->core).l_qseq;
    lVar18 = (long)(iVar29 + 1 >> 1);
    if (puVar7[lVar18 + lVar11] != 0xff) {
      if (0 < iVar29) {
        lVar32 = 0;
        do {
          uVar2 = puVar7[lVar32 + lVar18 + lVar11];
          sVar27 = str->l;
          uVar12 = sVar27 + 1;
          if (uVar12 < str->m) {
            pcVar13 = str->s;
LAB_00115169:
            str->l = uVar12;
            pcVar13[sVar27] = uVar2 + '!';
            str->s[str->l] = '\0';
          }
          else {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
            str->m = sVar26;
            uStack_60 = 0x115159;
            pcVar13 = (char *)realloc(str->s,sVar26);
            if (pcVar13 != (char *)0x0) {
              str->s = pcVar13;
              sVar27 = str->l;
              uVar12 = sVar27 + 1;
              goto LAB_00115169;
            }
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 < (pbVar28->core).l_qseq);
      }
      goto LAB_00115279;
    }
    sVar27 = str->l;
    uVar12 = sVar27 + 1;
    if (uVar12 < str->m) {
      pcVar13 = str->s;
    }
    else {
      uVar12 = uVar12 >> 1 | uVar12;
      uVar12 = uVar12 >> 2 | uVar12;
      uVar12 = uVar12 >> 4 | uVar12;
      uVar12 = uVar12 >> 8 | uVar12;
      sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
      str->m = sVar26;
      uStack_60 = 0x115258;
      pcVar13 = (char *)realloc(str->s,sVar26);
      if (pcVar13 == (char *)0x0) goto LAB_00115279;
      str->s = pcVar13;
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
    }
    str->l = uVar12;
    pcVar13[sVar27] = '*';
    pcVar13 = str->s + str->l;
  }
  *pcVar13 = '\0';
LAB_00115279:
  uVar12 = *(ulong *)&(pbVar28->core).field_0x8;
  puVar7 = pbVar28->data;
  iVar29 = (pbVar28->core).l_qseq;
  lVar11 = (long)(iVar29 + 1 >> 1) + (uVar12 >> 0x18 & 0xff) + (uVar12 >> 0x30) * 4;
  pdVar33 = (double *)(puVar7 + iVar29 + lVar11 + 4);
  if (pdVar33 <= puVar7 + pbVar28->l_data) {
    pdVar22 = (double *)(puVar7 + iVar29 + lVar11);
    do {
      cVar1 = *(char *)pdVar22;
      cVar3 = *(char *)((long)pdVar22 + 1);
      local_40 = (bam_hdr_t *)CONCAT71(local_40._1_7_,*(undefined1 *)((long)pdVar22 + 2));
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
      if (uVar12 < str->m) {
        pcVar13 = str->s;
LAB_00115348:
        str->l = uVar12;
        pcVar13[sVar27] = '\t';
        str->s[str->l] = '\0';
      }
      else {
        uVar12 = uVar12 >> 1 | uVar12;
        uVar12 = uVar12 >> 2 | uVar12;
        uVar12 = uVar12 >> 4 | uVar12;
        uVar12 = uVar12 >> 8 | uVar12;
        sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
        str->m = sVar26;
        uStack_60 = 0x115338;
        pcVar13 = (char *)realloc(str->s,sVar26);
        if (pcVar13 != (char *)0x0) {
          str->s = pcVar13;
          sVar27 = str->l;
          uVar12 = sVar27 + 1;
          goto LAB_00115348;
        }
      }
      sVar27 = str->l;
      uVar12 = sVar27 + 3;
      if (uVar12 < str->m) {
        pcVar13 = str->s;
LAB_001153ba:
        pcVar13[sVar27] = cVar1;
        pcVar13[sVar27 + 1] = cVar3;
        sVar27 = str->l;
        str->l = sVar27 + 2;
        str->s[sVar27 + 2] = '\0';
      }
      else {
        uVar12 = uVar12 >> 1 | uVar12;
        uVar12 = uVar12 >> 2 | uVar12;
        uVar12 = uVar12 >> 4 | uVar12;
        uVar12 = uVar12 >> 8 | uVar12;
        sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
        str->m = sVar26;
        uStack_60 = 0x1153ae;
        pcVar13 = (char *)realloc(str->s,sVar26);
        if (pcVar13 != (char *)0x0) {
          str->s = pcVar13;
          sVar27 = str->l;
          goto LAB_001153ba;
        }
      }
      sVar27 = str->l;
      uVar12 = sVar27 + 1;
      if (uVar12 < str->m) {
        pcVar13 = str->s;
LAB_00115462:
        str->l = uVar12;
        pcVar13[sVar27] = ':';
        str->s[str->l] = '\0';
        bVar23 = (byte)local_40;
      }
      else {
        uVar12 = uVar12 >> 1 | uVar12;
        uVar12 = uVar12 >> 2 | uVar12;
        uVar12 = uVar12 >> 4 | uVar12;
        uVar12 = uVar12 >> 8 | uVar12;
        sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
        str->m = sVar26;
        uStack_60 = 0x11543e;
        pcVar13 = (char *)realloc(str->s,sVar26);
        bVar23 = (byte)local_40;
        if (pcVar13 != (char *)0x0) {
          str->s = pcVar13;
          sVar27 = str->l;
          uVar12 = sVar27 + 1;
          goto LAB_00115462;
        }
      }
      pbVar28 = local_48;
      pdVar31 = (double *)((long)pdVar22 + 3);
      if (bVar23 < 0x5a) {
        switch(bVar23) {
        case 0x41:
          sVar27 = str->l;
          uVar12 = sVar27 + 3;
          if (uVar12 < str->m) {
            pcVar13 = str->s;
LAB_001159a1:
            (pcVar13 + sVar27)[0] = 'A';
            (pcVar13 + sVar27)[1] = ':';
            sVar27 = str->l;
            str->l = sVar27 + 2;
            str->s[sVar27 + 2] = '\0';
          }
          else {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
            str->m = sVar26;
            uStack_60 = 0x115995;
            pcVar13 = (char *)realloc(str->s,sVar26);
            if (pcVar13 != (char *)0x0) {
              str->s = pcVar13;
              sVar27 = str->l;
              goto LAB_001159a1;
            }
          }
          cVar1 = *(char *)pdVar31;
          sVar27 = str->l;
          uVar12 = sVar27 + 1;
          if (uVar12 < str->m) {
            pcVar13 = str->s;
          }
          else {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
            str->m = sVar26;
            uStack_60 = 0x115a11;
            pcVar13 = (char *)realloc(str->s,sVar26);
            pdVar22 = pdVar33;
            if (pcVar13 == (char *)0x0) goto LAB_0011668d;
            str->s = pcVar13;
            sVar27 = str->l;
            uVar12 = sVar27 + 1;
          }
          str->l = uVar12;
          pcVar13[sVar27] = cVar1;
LAB_00115a2c:
          str->s[str->l] = '\0';
          pdVar22 = pdVar33;
          goto LAB_0011668d;
        case 0x42:
          local_40 = (bam_hdr_t *)(long)(int)*(float *)pdVar33;
          if (local_48->data + local_48->l_data <=
              (uint8_t *)
              ((long)pdVar22 + (long)&((bam_hdr_t *)(long)(int)*(float *)pdVar33)->l_text)) {
            return -1;
          }
          bVar23 = *(byte *)pdVar31;
          sVar27 = str->l;
          uVar12 = sVar27 + 3;
          if (uVar12 < str->m) {
            pcVar13 = str->s;
LAB_00115d91:
            (pcVar13 + sVar27)[0] = 'B';
            (pcVar13 + sVar27)[1] = ':';
            sVar27 = str->l;
            str->l = sVar27 + 2;
            str->s[sVar27 + 2] = '\0';
          }
          else {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
            str->m = sVar26;
            uStack_60 = 0x115d85;
            pcVar13 = (char *)realloc(str->s,sVar26);
            if (pcVar13 != (char *)0x0) {
              str->s = pcVar13;
              sVar27 = str->l;
              goto LAB_00115d91;
            }
          }
          sVar27 = str->l;
          uVar12 = sVar27 + 1;
          if (uVar12 < str->m) {
            pcVar13 = str->s;
LAB_00115e22:
            str->l = uVar12;
            pcVar13[sVar27] = bVar23;
            str->s[str->l] = '\0';
          }
          else {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
            str->m = sVar26;
            uStack_60 = 0x115e08;
            pcVar13 = (char *)realloc(str->s,sVar26);
            if (pcVar13 != (char *)0x0) {
              str->s = pcVar13;
              sVar27 = str->l;
              uVar12 = sVar27 + 1;
              goto LAB_00115e22;
            }
          }
          pdVar22 = pdVar22 + 1;
          if (0 < (int)local_40) {
            iVar29 = 0;
            do {
              sVar27 = str->l;
              uVar12 = sVar27 + 1;
              if (uVar12 < str->m) {
                pcVar13 = str->s;
LAB_00115ebb:
                str->l = uVar12;
                pcVar13[sVar27] = ',';
                str->s[str->l] = '\0';
              }
              else {
                uVar12 = uVar12 >> 1 | uVar12;
                uVar12 = uVar12 >> 2 | uVar12;
                uVar12 = uVar12 >> 4 | uVar12;
                uVar12 = uVar12 >> 8 | uVar12;
                sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
                str->m = sVar26;
                uStack_60 = 0x115ea1;
                pcVar13 = (char *)realloc(str->s,sVar26);
                if (pcVar13 != (char *)0x0) {
                  str->s = pcVar13;
                  sVar27 = str->l;
                  uVar12 = sVar27 + 1;
                  goto LAB_00115ebb;
                }
              }
              if (bVar23 < 99) {
                if (bVar23 == 0x43) {
                  local_38 = pdVar22;
                  uVar25 = 1;
                  lVar11 = 0;
                  lVar18 = 0;
                  uVar10 = (uint)*(byte *)pdVar22;
                  iVar30 = 2;
                  do {
                    iVar21 = iVar30;
                    uVar12 = (ulong)uVar25;
                    local_58[lVar18] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
                    lVar18 = lVar18 + 1;
                    lVar11 = lVar11 + 0x100000000;
                    uVar25 = uVar25 + 1;
                    bVar8 = 9 < uVar10;
                    uVar10 = uVar10 / 10;
                    iVar30 = iVar21 + 1;
                  } while (bVar8);
                  uVar14 = (lVar11 >> 0x20) + str->l + 1;
                  if (str->m <= uVar14) {
                    uVar14 = uVar14 >> 1 | uVar14;
                    uVar14 = uVar14 >> 2 | uVar14;
                    uVar14 = uVar14 >> 4 | uVar14;
                    uVar14 = uVar14 >> 8 | uVar14;
                    sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
                    str->m = sVar26;
                    uStack_60 = 0x1161bf;
                    pcVar13 = (char *)realloc(str->s,sVar26);
                    pdVar22 = local_38;
                    if (pcVar13 == (char *)0x0) goto LAB_001162ee;
                    str->s = pcVar13;
                  }
                  pbVar20 = local_58 + (uVar12 - 1);
                  do {
                    bVar4 = *pbVar20;
                    sVar27 = str->l;
                    str->l = sVar27 + 1;
                    str->s[sVar27] = bVar4;
                    iVar21 = iVar21 + -1;
                    pbVar20 = pbVar20 + -1;
                  } while (1 < iVar21);
                  str->s[str->l] = '\0';
                  pdVar22 = local_38;
LAB_001162ee:
                  pdVar22 = (double *)((long)pdVar22 + 1);
                }
                else {
                  if (bVar23 == 0x49) {
                    uStack_60 = 0x1163db;
                    kputuw((uint)*(float *)pdVar22,str);
                    goto LAB_001163e5;
                  }
                  if (bVar23 == 0x53) {
                    local_38 = pdVar22;
                    uVar25 = 1;
                    lVar11 = 0;
                    lVar18 = 0;
                    uVar10 = (uint)*(ushort *)pdVar22;
                    iVar30 = 2;
                    do {
                      iVar21 = iVar30;
                      uVar12 = (ulong)uVar25;
                      local_58[lVar18] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
                      lVar18 = lVar18 + 1;
                      lVar11 = lVar11 + 0x100000000;
                      uVar25 = uVar25 + 1;
                      bVar8 = 9 < uVar10;
                      uVar10 = uVar10 / 10;
                      iVar30 = iVar21 + 1;
                    } while (bVar8);
                    uVar14 = (lVar11 >> 0x20) + str->l + 1;
                    if (str->m <= uVar14) {
                      uVar14 = uVar14 >> 1 | uVar14;
                      uVar14 = uVar14 >> 2 | uVar14;
                      uVar14 = uVar14 >> 4 | uVar14;
                      uVar14 = uVar14 >> 8 | uVar14;
                      sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
                      str->m = sVar26;
                      uStack_60 = 0x115fd0;
                      pcVar13 = (char *)realloc(str->s,sVar26);
                      pdVar22 = local_38;
                      if (pcVar13 == (char *)0x0) goto LAB_00116113;
                      str->s = pcVar13;
                    }
                    pbVar20 = local_58 + (uVar12 - 1);
                    do {
                      bVar4 = *pbVar20;
                      sVar27 = str->l;
                      str->l = sVar27 + 1;
                      str->s[sVar27] = bVar4;
                      iVar21 = iVar21 + -1;
                      pbVar20 = pbVar20 + -1;
                    } while (1 < iVar21);
                    str->s[str->l] = '\0';
                    pdVar22 = local_38;
                    goto LAB_00116113;
                  }
                }
              }
              else if (bVar23 < 0x69) {
                if (bVar23 == 99) {
                  bVar4 = *(byte *)pdVar22;
                  uVar12 = 0;
                  uVar10 = (uint)(byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7));
                  do {
                    local_58[uVar12] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
                    uVar12 = uVar12 + 1;
                    bVar8 = 9 < uVar10;
                    uVar10 = uVar10 / 10;
                  } while (bVar8);
                  if ((char)bVar4 < '\0') {
                    uVar14 = uVar12 & 0xffffffff;
                    uVar12 = (ulong)((int)uVar12 + 1);
                    local_58[uVar14] = 0x2d;
                  }
                  uVar14 = str->l + (long)(int)uVar12 + 1;
                  if (str->m <= uVar14) {
                    uVar14 = uVar14 >> 1 | uVar14;
                    uVar14 = uVar14 >> 2 | uVar14;
                    uVar14 = uVar14 >> 4 | uVar14;
                    uVar14 = uVar14 >> 8 | uVar14;
                    sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
                    str->m = sVar26;
                    uStack_60 = 0x1162a7;
                    pcVar13 = (char *)realloc(str->s,sVar26);
                    if (pcVar13 == (char *)0x0) goto LAB_001162ee;
                    str->s = pcVar13;
                  }
                  iVar30 = (int)uVar12 + 1;
                  pbVar20 = local_58 + ((uVar12 & 0xffffffff) - 1);
                  do {
                    bVar4 = *pbVar20;
                    sVar27 = str->l;
                    str->l = sVar27 + 1;
                    str->s[sVar27] = bVar4;
                    iVar30 = iVar30 + -1;
                    pbVar20 = pbVar20 + -1;
                  } while (1 < iVar30);
                  str->s[str->l] = '\0';
                  goto LAB_001162ee;
                }
                if (bVar23 == 0x66) {
                  uStack_60 = 0x115f0a;
                  ksprintf(str,"%g",(double)*(float *)pdVar22);
                  goto LAB_001163e5;
                }
              }
              else if (bVar23 == 0x69) {
                fVar6 = *(float *)pdVar22;
                fVar9 = (float)-(int)fVar6;
                if (0 < (int)fVar6) {
                  fVar9 = fVar6;
                }
                uVar12 = 0;
                do {
                  local_58[uVar12] = SUB41(fVar9,0) + (char)((uint)fVar9 / 10) * -10 | 0x30;
                  uVar12 = uVar12 + 1;
                  bVar8 = 9 < (uint)fVar9;
                  fVar9 = (float)((uint)fVar9 / 10);
                } while (bVar8);
                if ((int)fVar6 < 0) {
                  uVar14 = uVar12 & 0xffffffff;
                  uVar12 = (ulong)((int)uVar12 + 1);
                  local_58[uVar14] = 0x2d;
                }
                uVar14 = str->l + (long)(int)uVar12 + 1;
                if (str->m <= uVar14) {
                  uVar14 = uVar14 >> 1 | uVar14;
                  uVar14 = uVar14 >> 2 | uVar14;
                  uVar14 = uVar14 >> 4 | uVar14;
                  uVar14 = uVar14 >> 8 | uVar14;
                  sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
                  str->m = sVar26;
                  uStack_60 = 0x116387;
                  pcVar13 = (char *)realloc(str->s,sVar26);
                  if (pcVar13 == (char *)0x0) goto LAB_001163e5;
                  str->s = pcVar13;
                }
                iVar30 = (int)uVar12 + 1;
                pbVar20 = local_58 + ((uVar12 & 0xffffffff) - 1);
                do {
                  bVar4 = *pbVar20;
                  sVar27 = str->l;
                  str->l = sVar27 + 1;
                  str->s[sVar27] = bVar4;
                  iVar30 = iVar30 + -1;
                  pbVar20 = pbVar20 + -1;
                } while (1 < iVar30);
                str->s[str->l] = '\0';
LAB_001163e5:
                pdVar22 = (double *)((long)pdVar22 + 4);
              }
              else if (bVar23 == 0x73) {
                uVar5 = *(ushort *)pdVar22;
                uVar19 = -uVar5;
                if (0 < (short)uVar5) {
                  uVar19 = uVar5;
                }
                uVar12 = 0;
                uVar10 = (uint)uVar19;
                do {
                  local_58[uVar12] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
                  uVar12 = uVar12 + 1;
                  bVar8 = 9 < uVar10;
                  uVar10 = uVar10 / 10;
                } while (bVar8);
                if ((short)uVar5 < 0) {
                  uVar14 = uVar12 & 0xffffffff;
                  uVar12 = (ulong)((int)uVar12 + 1);
                  local_58[uVar14] = 0x2d;
                }
                uVar14 = str->l + (long)(int)uVar12 + 1;
                if (str->m <= uVar14) {
                  uVar14 = uVar14 >> 1 | uVar14;
                  uVar14 = uVar14 >> 2 | uVar14;
                  uVar14 = uVar14 >> 4 | uVar14;
                  uVar14 = uVar14 >> 8 | uVar14;
                  sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
                  str->m = sVar26;
                  uStack_60 = 0x1160cc;
                  pcVar13 = (char *)realloc(str->s,sVar26);
                  if (pcVar13 == (char *)0x0) goto LAB_00116113;
                  str->s = pcVar13;
                }
                iVar30 = (int)uVar12 + 1;
                pbVar20 = local_58 + ((uVar12 & 0xffffffff) - 1);
                do {
                  bVar4 = *pbVar20;
                  sVar27 = str->l;
                  str->l = sVar27 + 1;
                  str->s[sVar27] = bVar4;
                  iVar30 = iVar30 + -1;
                  pbVar20 = pbVar20 + -1;
                } while (1 < iVar30);
                str->s[str->l] = '\0';
LAB_00116113:
                pdVar22 = (double *)((long)pdVar22 + 2);
              }
              iVar29 = iVar29 + 1;
            } while (iVar29 != (int)local_40);
          }
          goto LAB_0011668d;
        case 0x43:
          sVar27 = str->l;
          uVar12 = sVar27 + 3;
          if (uVar12 < str->m) {
            pcVar13 = str->s;
LAB_00115a93:
            (pcVar13 + sVar27)[0] = 'i';
            (pcVar13 + sVar27)[1] = ':';
            sVar27 = str->l;
            str->l = sVar27 + 2;
            str->s[sVar27 + 2] = '\0';
          }
          else {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
            str->m = sVar26;
            uStack_60 = 0x115a7d;
            pcVar13 = (char *)realloc(str->s,sVar26);
            if (pcVar13 != (char *)0x0) {
              str->s = pcVar13;
              sVar27 = str->l;
              goto LAB_00115a93;
            }
          }
          uVar25 = 1;
          lVar11 = 0;
          lVar18 = 0;
          iVar29 = 2;
          uVar10 = (uint)*(byte *)pdVar31;
          do {
            iVar30 = iVar29;
            uVar12 = (ulong)uVar25;
            local_58[lVar18] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
            lVar18 = lVar18 + 1;
            lVar11 = lVar11 + 0x100000000;
            uVar25 = uVar25 + 1;
            bVar8 = 9 < uVar10;
            iVar29 = iVar30 + 1;
            uVar10 = uVar10 / 10;
          } while (bVar8);
          uVar14 = (lVar11 >> 0x20) + str->l + 1;
          if (str->m <= uVar14) {
            uVar14 = uVar14 >> 1 | uVar14;
            uVar14 = uVar14 >> 2 | uVar14;
            uVar14 = uVar14 >> 4 | uVar14;
            uVar14 = uVar14 >> 8 | uVar14;
            sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
            str->m = sVar26;
            uStack_60 = 0x115b4f;
            pcVar13 = (char *)realloc(str->s,sVar26);
            pdVar22 = pdVar33;
            if (pcVar13 == (char *)0x0) goto LAB_0011668d;
            str->s = pcVar13;
          }
          pbVar20 = local_58 + (uVar12 - 1);
          do {
            bVar23 = *pbVar20;
            sVar27 = str->l;
            str->l = sVar27 + 1;
            str->s[sVar27] = bVar23;
            iVar30 = iVar30 + -1;
            pbVar20 = pbVar20 + -1;
          } while (1 < iVar30);
          str->s[str->l] = '\0';
          pdVar22 = pdVar33;
          goto LAB_0011668d;
        case 0x44:
        case 0x45:
        case 0x46:
        case 0x47:
          break;
        case 0x48:
switchD_0011549b_caseD_48:
          sVar27 = str->l;
          uVar12 = sVar27 + 1;
          if (uVar12 < str->m) {
            pcVar13 = str->s;
LAB_001156d9:
            str->l = uVar12;
            pcVar13[sVar27] = bVar23;
            str->s[str->l] = '\0';
          }
          else {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
            str->m = sVar26;
            uStack_60 = 0x1156c4;
            pcVar13 = (char *)realloc(str->s,sVar26);
            if (pcVar13 != (char *)0x0) {
              str->s = pcVar13;
              sVar27 = str->l;
              uVar12 = sVar27 + 1;
              bVar23 = (byte)local_40;
              goto LAB_001156d9;
            }
          }
          sVar27 = str->l;
          uVar12 = sVar27 + 1;
          if (uVar12 < str->m) {
            pcVar13 = str->s;
LAB_0011574f:
            str->l = uVar12;
            pcVar13[sVar27] = ':';
            str->s[str->l] = '\0';
          }
          else {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
            str->m = sVar26;
            uStack_60 = 0x11573f;
            pcVar13 = (char *)realloc(str->s,sVar26);
            if (pcVar13 != (char *)0x0) {
              str->s = pcVar13;
              sVar27 = str->l;
              uVar12 = sVar27 + 1;
              goto LAB_0011574f;
            }
          }
          pdVar33 = (double *)(pbVar28->data + pbVar28->l_data);
          while( true ) {
            if (pdVar33 <= pdVar31) {
              return -1;
            }
            cVar1 = *(char *)pdVar31;
            if (cVar1 == '\0') break;
            sVar27 = str->l;
            uVar12 = sVar27 + 1;
            if (uVar12 < str->m) {
              pcVar13 = str->s;
LAB_001157e7:
              str->l = uVar12;
              pcVar13[sVar27] = cVar1;
              str->s[str->l] = '\0';
            }
            else {
              uVar12 = uVar12 >> 1 | uVar12;
              uVar12 = uVar12 >> 2 | uVar12;
              uVar12 = uVar12 >> 4 | uVar12;
              uVar12 = uVar12 >> 8 | uVar12;
              sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
              str->m = sVar26;
              uStack_60 = 0x1157d7;
              pcVar13 = (char *)realloc(str->s,sVar26);
              if (pcVar13 != (char *)0x0) {
                str->s = pcVar13;
                sVar27 = str->l;
                uVar12 = sVar27 + 1;
                goto LAB_001157e7;
              }
            }
            pdVar31 = (double *)((long)pdVar31 + 1);
            pdVar33 = (double *)(pbVar28->data + pbVar28->l_data);
          }
          pdVar31 = (double *)((long)pdVar31 + 1);
          break;
        case 0x49:
          pdVar22 = (double *)((long)pdVar22 + 7);
          if (local_48->data + local_48->l_data < pdVar22) {
            return -1;
          }
          sVar27 = str->l;
          uVar12 = sVar27 + 3;
          if (uVar12 < str->m) {
            pcVar13 = str->s;
LAB_00115d1b:
            (pcVar13 + sVar27)[0] = 'i';
            (pcVar13 + sVar27)[1] = ':';
            sVar27 = str->l;
            str->l = sVar27 + 2;
            str->s[sVar27 + 2] = '\0';
          }
          else {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
            str->m = sVar26;
            uStack_60 = 0x115d0f;
            pcVar13 = (char *)realloc(str->s,sVar26);
            if (pcVar13 != (char *)0x0) {
              str->s = pcVar13;
              sVar27 = str->l;
              goto LAB_00115d1b;
            }
          }
          uStack_60 = 0x115d3f;
          kputuw((uint)*(float *)pdVar31,str);
          goto LAB_0011668d;
        default:
          if (bVar23 == 0x53) {
            pdVar22 = (double *)((long)pdVar22 + 5);
            if (local_48->data + local_48->l_data < pdVar22) {
              return -1;
            }
            sVar27 = str->l;
            uVar12 = sVar27 + 3;
            if (uVar12 < str->m) {
              pcVar13 = str->s;
LAB_00116593:
              (pcVar13 + sVar27)[0] = 'i';
              (pcVar13 + sVar27)[1] = ':';
              sVar27 = str->l;
              str->l = sVar27 + 2;
              str->s[sVar27 + 2] = '\0';
            }
            else {
              uVar12 = uVar12 >> 1 | uVar12;
              uVar12 = uVar12 >> 2 | uVar12;
              uVar12 = uVar12 >> 4 | uVar12;
              uVar12 = uVar12 >> 8 | uVar12;
              sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
              str->m = sVar26;
              uStack_60 = 0x11657d;
              pcVar13 = (char *)realloc(str->s,sVar26);
              if (pcVar13 != (char *)0x0) {
                str->s = pcVar13;
                sVar27 = str->l;
                goto LAB_00116593;
              }
            }
            uVar25 = 1;
            lVar11 = 0;
            lVar18 = 0;
            iVar29 = 2;
            uVar10 = (uint)*(ushort *)pdVar31;
            do {
              iVar30 = iVar29;
              uVar12 = (ulong)uVar25;
              local_58[lVar18] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
              lVar18 = lVar18 + 1;
              lVar11 = lVar11 + 0x100000000;
              uVar25 = uVar25 + 1;
              bVar8 = 9 < uVar10;
              iVar29 = iVar30 + 1;
              uVar10 = uVar10 / 10;
            } while (bVar8);
            uVar14 = (lVar11 >> 0x20) + str->l + 1;
            if (str->m <= uVar14) {
              uVar14 = uVar14 >> 1 | uVar14;
              uVar14 = uVar14 >> 2 | uVar14;
              uVar14 = uVar14 >> 4 | uVar14;
              uVar14 = uVar14 >> 8 | uVar14;
              sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
              str->m = sVar26;
              uStack_60 = 0x11664c;
              pcVar13 = (char *)realloc(str->s,sVar26);
              if (pcVar13 == (char *)0x0) goto LAB_0011668d;
              str->s = pcVar13;
            }
            pbVar20 = local_58 + (uVar12 - 1);
            do {
              bVar23 = *pbVar20;
              sVar27 = str->l;
              str->l = sVar27 + 1;
              str->s[sVar27] = bVar23;
              iVar30 = iVar30 + -1;
              pbVar20 = pbVar20 + -1;
            } while (1 < iVar30);
            goto LAB_0011667f;
          }
        }
switchD_0011549b_caseD_44:
        pdVar22 = pdVar31;
        goto LAB_0011668d;
      }
      switch(bVar23) {
      case 99:
        sVar27 = str->l;
        uVar12 = sVar27 + 3;
        if (uVar12 < str->m) {
          pcVar13 = str->s;
LAB_00115861:
          (pcVar13 + sVar27)[0] = 'i';
          (pcVar13 + sVar27)[1] = ':';
          sVar27 = str->l;
          str->l = sVar27 + 2;
          str->s[sVar27 + 2] = '\0';
        }
        else {
          uVar12 = uVar12 >> 1 | uVar12;
          uVar12 = uVar12 >> 2 | uVar12;
          uVar12 = uVar12 >> 4 | uVar12;
          uVar12 = uVar12 >> 8 | uVar12;
          sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
          str->m = sVar26;
          uStack_60 = 0x115855;
          pcVar13 = (char *)realloc(str->s,sVar26);
          if (pcVar13 != (char *)0x0) {
            str->s = pcVar13;
            sVar27 = str->l;
            goto LAB_00115861;
          }
        }
        bVar23 = *(byte *)pdVar31;
        uVar12 = 0;
        uVar10 = (uint)(byte)((bVar23 ^ (char)bVar23 >> 7) - ((char)bVar23 >> 7));
        do {
          local_58[uVar12] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
          uVar12 = uVar12 + 1;
          bVar8 = 9 < uVar10;
          uVar10 = uVar10 / 10;
        } while (bVar8);
        if ((char)bVar23 < '\0') {
          uVar14 = uVar12 & 0xffffffff;
          uVar12 = (ulong)((int)uVar12 + 1);
          local_58[uVar14] = 0x2d;
        }
        uVar14 = str->l + (long)(int)uVar12 + 1;
        if (str->m <= uVar14) {
          uVar14 = uVar14 >> 1 | uVar14;
          uVar14 = uVar14 >> 2 | uVar14;
          uVar14 = uVar14 >> 4 | uVar14;
          uVar14 = uVar14 >> 8 | uVar14;
          sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
          str->m = sVar26;
          uStack_60 = 0x115915;
          pcVar13 = (char *)realloc(str->s,sVar26);
          pdVar22 = pdVar33;
          if (pcVar13 == (char *)0x0) break;
          str->s = pcVar13;
        }
        iVar29 = (int)uVar12 + 1;
        pbVar20 = local_58 + ((uVar12 & 0xffffffff) - 1);
        do {
          bVar23 = *pbVar20;
          sVar27 = str->l;
          str->l = sVar27 + 1;
          str->s[sVar27] = bVar23;
          iVar29 = iVar29 + -1;
          pbVar20 = pbVar20 + -1;
        } while (1 < iVar29);
        goto LAB_00115a2c;
      case 100:
        pdVar22 = (double *)((long)pdVar22 + 0xb);
        if (local_48->data + local_48->l_data < pdVar22) {
          return -1;
        }
        dVar34 = *pdVar31;
        pcVar13 = "d:%g";
        goto LAB_001155f1;
      case 0x65:
      case 0x67:
      case 0x68:
        goto switchD_0011549b_caseD_44;
      case 0x66:
        pdVar22 = (double *)((long)pdVar22 + 7);
        if (local_48->data + local_48->l_data < pdVar22) {
          return -1;
        }
        dVar34 = (double)*(float *)pdVar31;
        pcVar13 = "f:%g";
LAB_001155f1:
        uStack_60 = 0x1155f8;
        ksprintf(str,pcVar13,dVar34);
        break;
      case 0x69:
        pdVar22 = (double *)((long)pdVar22 + 7);
        if (local_48->data + local_48->l_data < pdVar22) {
          return -1;
        }
        sVar27 = str->l;
        uVar12 = sVar27 + 3;
        if (uVar12 < str->m) {
          pcVar13 = str->s;
LAB_00115be2:
          (pcVar13 + sVar27)[0] = 'i';
          (pcVar13 + sVar27)[1] = ':';
          sVar27 = str->l;
          str->l = sVar27 + 2;
          str->s[sVar27 + 2] = '\0';
        }
        else {
          uVar12 = uVar12 >> 1 | uVar12;
          uVar12 = uVar12 >> 2 | uVar12;
          uVar12 = uVar12 >> 4 | uVar12;
          uVar12 = uVar12 >> 8 | uVar12;
          sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
          str->m = sVar26;
          uStack_60 = 0x115bd6;
          pcVar13 = (char *)realloc(str->s,sVar26);
          if (pcVar13 != (char *)0x0) {
            str->s = pcVar13;
            sVar27 = str->l;
            goto LAB_00115be2;
          }
        }
        fVar6 = *(float *)pdVar31;
        fVar9 = (float)-(int)fVar6;
        if (0 < (int)fVar6) {
          fVar9 = fVar6;
        }
        uVar12 = 0;
        do {
          local_58[uVar12] = SUB41(fVar9,0) + (char)((uint)fVar9 / 10) * -10 | 0x30;
          uVar12 = uVar12 + 1;
          bVar8 = 9 < (uint)fVar9;
          fVar9 = (float)((uint)fVar9 / 10);
        } while (bVar8);
        if ((int)fVar6 < 0) {
          uVar14 = uVar12 & 0xffffffff;
          uVar12 = (ulong)((int)uVar12 + 1);
          local_58[uVar14] = 0x2d;
        }
        uVar14 = str->l + (long)(int)uVar12 + 1;
        if (str->m <= uVar14) {
          uVar14 = uVar14 >> 1 | uVar14;
          uVar14 = uVar14 >> 2 | uVar14;
          uVar14 = uVar14 >> 4 | uVar14;
          uVar14 = uVar14 >> 8 | uVar14;
          sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
          str->m = sVar26;
          uStack_60 = 0x115c8f;
          pcVar13 = (char *)realloc(str->s,sVar26);
          if (pcVar13 == (char *)0x0) break;
          str->s = pcVar13;
        }
        iVar29 = (int)uVar12 + 1;
        pbVar20 = local_58 + ((uVar12 & 0xffffffff) - 1);
        do {
          bVar23 = *pbVar20;
          sVar27 = str->l;
          str->l = sVar27 + 1;
          str->s[sVar27] = bVar23;
          iVar29 = iVar29 + -1;
          pbVar20 = pbVar20 + -1;
        } while (1 < iVar29);
LAB_0011667f:
        str->s[str->l] = '\0';
        break;
      default:
        if (bVar23 == 0x5a) goto switchD_0011549b_caseD_48;
        if (bVar23 != 0x73) goto switchD_0011549b_caseD_44;
        pdVar22 = (double *)((long)pdVar22 + 5);
        if (local_48->data + local_48->l_data < pdVar22) {
          return -1;
        }
        sVar27 = str->l;
        uVar12 = sVar27 + 3;
        if (uVar12 < str->m) {
          pcVar13 = str->s;
LAB_00116449:
          (pcVar13 + sVar27)[0] = 'i';
          (pcVar13 + sVar27)[1] = ':';
          sVar27 = str->l;
          str->l = sVar27 + 2;
          str->s[sVar27 + 2] = '\0';
        }
        else {
          uVar12 = uVar12 >> 1 | uVar12;
          uVar12 = uVar12 >> 2 | uVar12;
          uVar12 = uVar12 >> 4 | uVar12;
          uVar12 = uVar12 >> 8 | uVar12;
          sVar26 = (uVar12 >> 0x10 | uVar12) + 1;
          str->m = sVar26;
          uStack_60 = 0x11643d;
          pcVar13 = (char *)realloc(str->s,sVar26);
          if (pcVar13 != (char *)0x0) {
            str->s = pcVar13;
            sVar27 = str->l;
            goto LAB_00116449;
          }
        }
        uVar5 = *(ushort *)pdVar31;
        uVar19 = -uVar5;
        if (0 < (short)uVar5) {
          uVar19 = uVar5;
        }
        uVar12 = 0;
        uVar10 = (uint)uVar19;
        do {
          local_58[uVar12] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
          uVar12 = uVar12 + 1;
          bVar8 = 9 < uVar10;
          uVar10 = uVar10 / 10;
        } while (bVar8);
        if ((short)uVar5 < 0) {
          uVar14 = uVar12 & 0xffffffff;
          uVar12 = (ulong)((int)uVar12 + 1);
          local_58[uVar14] = 0x2d;
        }
        uVar14 = str->l + (long)(int)uVar12 + 1;
        if (uVar14 < str->m) {
LAB_0011650a:
          iVar29 = (int)uVar12 + 1;
          pbVar20 = local_58 + ((uVar12 & 0xffffffff) - 1);
          do {
            bVar23 = *pbVar20;
            sVar27 = str->l;
            str->l = sVar27 + 1;
            str->s[sVar27] = bVar23;
            iVar29 = iVar29 + -1;
            pbVar20 = pbVar20 + -1;
          } while (1 < iVar29);
          goto LAB_0011667f;
        }
        uVar14 = uVar14 >> 1 | uVar14;
        uVar14 = uVar14 >> 2 | uVar14;
        uVar14 = uVar14 >> 4 | uVar14;
        uVar14 = uVar14 >> 8 | uVar14;
        sVar26 = (uVar14 >> 0x10 | uVar14) + 1;
        str->m = sVar26;
        uStack_60 = 0x1164fd;
        pcVar13 = (char *)realloc(str->s,sVar26);
        if (pcVar13 != (char *)0x0) {
          str->s = pcVar13;
          goto LAB_0011650a;
        }
      }
LAB_0011668d:
      pdVar33 = (double *)((long)pdVar22 + 4);
    } while (pdVar33 <= local_48->data + local_48->l_data);
  }
  return (int)str->l;
}

Assistant:

int sam_format1(const bam_hdr_t *h, const bam1_t *b, kstring_t *str)
{
    int i;
    uint8_t *s;
    const bam1_core_t *c = &b->core;

    str->l = 0;
    kputsn(bam_get_qname(b), c->l_qname-1, str); kputc('\t', str); // query name
    kputw(c->flag, str); kputc('\t', str); // flag
    if (c->tid >= 0) { // chr
        kputs(h->target_name[c->tid] , str);
        kputc('\t', str);
    } else kputsn("*\t", 2, str);
    kputw(c->pos + 1, str); kputc('\t', str); // pos
    kputw(c->qual, str); kputc('\t', str); // qual
    if (c->n_cigar) { // cigar
        uint32_t *cigar = bam_get_cigar(b);
        for (i = 0; i < c->n_cigar; ++i) {
            kputw(bam_cigar_oplen(cigar[i]), str);
            kputc(bam_cigar_opchr(cigar[i]), str);
        }
    } else kputc('*', str);
    kputc('\t', str);
    if (c->mtid < 0) kputsn("*\t", 2, str); // mate chr
    else if (c->mtid == c->tid) kputsn("=\t", 2, str);
    else {
        kputs(h->target_name[c->mtid], str);
        kputc('\t', str);
    }
    kputw(c->mpos + 1, str); kputc('\t', str); // mate pos
    kputw(c->isize, str); kputc('\t', str); // template len
    if (c->l_qseq) { // seq and qual
        uint8_t *s = bam_get_seq(b);
        for (i = 0; i < c->l_qseq; ++i) kputc("=ACMGRSVTWYHKDBN"[bam_seqi(s, i)], str);
        kputc('\t', str);
        s = bam_get_qual(b);
        if (s[0] == 0xff) kputc('*', str);
        else for (i = 0; i < c->l_qseq; ++i) kputc(s[i] + 33, str);
    } else kputsn("*\t*", 3, str);
    s = bam_get_aux(b); // aux
    while (s+4 <= b->data + b->l_data) {
        uint8_t type, key[2];
        key[0] = s[0]; key[1] = s[1];
        s += 2; type = *s++;
        kputc('\t', str); kputsn((char*)key, 2, str); kputc(':', str);
        if (type == 'A') {
            kputsn("A:", 2, str);
            kputc(*s, str);
            ++s;
        } else if (type == 'C') {
            kputsn("i:", 2, str);
            kputw(*s, str);
            ++s;
        } else if (type == 'c') {
            kputsn("i:", 2, str);
            kputw(*(int8_t*)s, str);
            ++s;
        } else if (type == 'S') {
            if (s+2 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(uint16_t*)s, str);
                s += 2;
            } else return -1;
        } else if (type == 's') {
            if (s+2 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(int16_t*)s, str);
                s += 2;
            } else return -1;
        } else if (type == 'I') {
            if (s+4 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputuw(*(uint32_t*)s, str);
                s += 4;
            } else return -1;
        } else if (type == 'i') {
            if (s+4 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(int32_t*)s, str);
                s += 4;
            } else return -1;
        } else if (type == 'f') {
            if (s+4 <= b->data + b->l_data) {
                ksprintf(str, "f:%g", *(float*)s);
                s += 4;
            } else return -1;

        } else if (type == 'd') {
            if (s+8 <= b->data + b->l_data) {
                ksprintf(str, "d:%g", *(double*)s);
                s += 8;
            } else return -1;
        } else if (type == 'Z' || type == 'H') {
            kputc(type, str); kputc(':', str);
            while (s < b->data + b->l_data && *s) kputc(*s++, str);
            if (s >= b->data + b->l_data)
                return -1;
            ++s;
        } else if (type == 'B') {
            uint8_t sub_type = *(s++);
            int32_t n;
            memcpy(&n, s, 4);
            s += 4; // no point to the start of the array
            if (s + n >= b->data + b->l_data)
                return -1;
            kputsn("B:", 2, str); kputc(sub_type, str); // write the typing
            for (i = 0; i < n; ++i) { // FIXME: for better performance, put the loop after "if"
                kputc(',', str);
                if ('c' == sub_type)      { kputw(*(int8_t*)s, str); ++s; }
                else if ('C' == sub_type) { kputw(*(uint8_t*)s, str); ++s; }
                else if ('s' == sub_type) { kputw(*(int16_t*)s, str); s += 2; }
                else if ('S' == sub_type) { kputw(*(uint16_t*)s, str); s += 2; }
                else if ('i' == sub_type) { kputw(*(int32_t*)s, str); s += 4; }
                else if ('I' == sub_type) { kputuw(*(uint32_t*)s, str); s += 4; }
                else if ('f' == sub_type) { ksprintf(str, "%g", *(float*)s); s += 4; }
            }
        }
    }
    return str->l;
}